

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PermutationMatrix.h
# Opt level: O0

void __thiscall
Eigen::internal::
permut_matrix_product_retval<Eigen::PermutationMatrix<-1,-1,int>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,-1,-1,0,-1,-1>>,1,false>
::evalTo<Eigen::Matrix<double,_1,_1,0,_1,_1>>
          (permut_matrix_product_retval<Eigen::PermutationMatrix<_1,_1,int>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>,1,false>
           *this,Matrix<double,__1,__1,_0,__1,__1> *dst)

{
  Index xpr;
  PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *this_00;
  Scalar *pSVar1;
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> local_90;
  Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>
  local_68;
  int local_2c;
  Scalar *pSStack_28;
  int i;
  Scalar *dst_data;
  Index n;
  Matrix<double,__1,__1,_0,__1,__1> *dst_local;
  permut_matrix_product_retval<Eigen::PermutationMatrix<_1,__1,_int>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,_false>
  *this_local;
  
  n = (Index)dst;
  dst_local = (Matrix<double,__1,__1,_0,__1,__1> *)this;
  dst_data = (Scalar *)
             permut_matrix_product_retval<Eigen::PermutationMatrix<-1,_-1,_int>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_1,_false>
             ::rows((permut_matrix_product_retval<Eigen::PermutationMatrix<_1,__1,_int>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,_false>
                     *)this);
  pSStack_28 = extract_data<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                         ((Matrix<double,__1,__1,_0,__1,__1> *)n);
  for (local_2c = 0; (long)local_2c < (long)dst_data; local_2c = local_2c + 1) {
    Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_1,_-1,_false>
    ::Block(&local_68,
            (CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
             *)(this + 8),(long)local_2c);
    xpr = n;
    this_00 = &PermutationMatrix<-1,_-1,_int>::indices(*(PermutationMatrix<_1,__1,_int> **)this)->
               super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>;
    pSVar1 = PlainObjectBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::coeff(this_00,(long)local_2c);
    Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
              (&local_90,(Matrix<double,__1,__1,_0,__1,__1> *)xpr,(long)*pSVar1);
    Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,1,-1,false>::operator=
              ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false> *)&local_90,
               (DenseBase<Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>_>
                *)&local_68);
  }
  return;
}

Assistant:

inline void evalTo(Dest& dst) const
    {
      const Index n = Side==OnTheLeft ? rows() : cols();
      // FIXME we need an is_same for expression that is not sensitive to constness. For instance
      // is_same_xpr<Block<const Matrix>, Block<Matrix> >::value should be true.
      const typename Dest::Scalar *dst_data = internal::extract_data(dst);
      if(    is_same<MatrixTypeNestedCleaned,Dest>::value
          && blas_traits<MatrixTypeNestedCleaned>::HasUsableDirectAccess
          && blas_traits<Dest>::HasUsableDirectAccess
          && dst_data!=0 && dst_data == extract_data(m_matrix))
      {
        // apply the permutation inplace
        Matrix<bool,PermutationType::RowsAtCompileTime,1,0,PermutationType::MaxRowsAtCompileTime> mask(m_permutation.size());
        mask.fill(false);
        Index r = 0;
        while(r < m_permutation.size())
        {
          // search for the next seed
          while(r<m_permutation.size() && mask[r]) r++;
          if(r>=m_permutation.size())
            break;
          // we got one, let's follow it until we are back to the seed
          Index k0 = r++;
          Index kPrev = k0;
          mask.coeffRef(k0) = true;
          for(Index k=m_permutation.indices().coeff(k0); k!=k0; k=m_permutation.indices().coeff(k))
          {
                  Block<Dest, Side==OnTheLeft ? 1 : Dest::RowsAtCompileTime, Side==OnTheRight ? 1 : Dest::ColsAtCompileTime>(dst, k)
            .swap(Block<Dest, Side==OnTheLeft ? 1 : Dest::RowsAtCompileTime, Side==OnTheRight ? 1 : Dest::ColsAtCompileTime>
                       (dst,((Side==OnTheLeft) ^ Transposed) ? k0 : kPrev));

            mask.coeffRef(k) = true;
            kPrev = k;
          }
        }
      }
      else
      {
        for(int i = 0; i < n; ++i)
        {
          Block<Dest, Side==OnTheLeft ? 1 : Dest::RowsAtCompileTime, Side==OnTheRight ? 1 : Dest::ColsAtCompileTime>
               (dst, ((Side==OnTheLeft) ^ Transposed) ? m_permutation.indices().coeff(i) : i)

          =

          Block<const MatrixTypeNestedCleaned,Side==OnTheLeft ? 1 : MatrixType::RowsAtCompileTime,Side==OnTheRight ? 1 : MatrixType::ColsAtCompileTime>
               (m_matrix, ((Side==OnTheRight) ^ Transposed) ? m_permutation.indices().coeff(i) : i);
        }
      }
    }